

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O1

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  ulong __n;
  uint uVar9;
  ulong unaff_R15;
  char cVar10;
  bool bVar11;
  bool bVar12;
  uchar check [16];
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  _Bool local_170;
  uint local_168 [4];
  uint local_158 [4];
  char *local_148;
  size_t local_140;
  char local_138 [128];
  char local_b8 [136];
  
  if (no_proxy == (char *)0x0) {
    return false;
  }
  if (*no_proxy == '\0') {
    return false;
  }
  iVar2 = strcmp("*",no_proxy);
  if (iVar2 == 0) {
    local_170 = true;
    bVar11 = false;
    goto LAB_0013fbc4;
  }
  if (*name == '[') {
    pcVar4 = strchr(name,0x5d);
    if (pcVar4 == (char *)0x0) {
LAB_0013f8c5:
      cVar10 = '\0';
      bVar11 = false;
    }
    else {
      pcVar8 = name + 1;
      unaff_R15 = (long)pcVar4 - (long)pcVar8;
      name = pcVar8;
      if (0x7f < unaff_R15) goto LAB_0013f8c5;
      name = local_b8;
      memcpy(name,pcVar8,unaff_R15);
      local_b8[unaff_R15] = '\0';
      bVar11 = true;
      cVar10 = '\x02';
    }
    if (!bVar11) {
      bVar11 = false;
      local_170 = false;
      goto LAB_0013fbc4;
    }
  }
  else {
    iVar2 = inet_pton(2,name,local_b8);
    cVar10 = iVar2 == 1;
    unaff_R15 = strlen(name);
  }
  local_148 = name + unaff_R15 + 1;
  local_170 = false;
  local_140 = unaff_R15;
  do {
    bVar11 = *no_proxy == '\0';
    if (bVar11) break;
    pcVar8 = local_138 + -(long)no_proxy;
    pcVar4 = no_proxy + -1;
    for (; (cVar1 = *no_proxy, cVar1 == '\t' || (cVar1 == ' ')); no_proxy = no_proxy + 1) {
      pcVar8 = pcVar8 + -1;
      pcVar4 = pcVar4 + 1;
    }
    __n = 0;
    while ((0x2c < (ulong)(byte)no_proxy[__n] ||
           ((0x100100000201U >> ((ulong)(byte)no_proxy[__n] & 0x3f) & 1) == 0))) {
      __n = __n + 1;
      pcVar4 = pcVar4 + 1;
    }
    if (__n == 0) goto LAB_0013fb89;
    if (cVar10 == '\0') {
      if (cVar1 == '.') {
        if (__n - 1 <= unaff_R15) {
          pcVar8 = local_148 + -__n;
          pcVar6 = no_proxy + 1;
LAB_0013f9cf:
          iVar2 = Curl_strncasecompare(pcVar6,pcVar8,unaff_R15);
          bVar12 = iVar2 != 0;
          goto LAB_0013fb77;
        }
      }
      else {
        pcVar8 = name;
        pcVar6 = no_proxy;
        if (unaff_R15 == __n) goto LAB_0013f9cf;
      }
LAB_0013fb89:
      do {
        pcVar8 = pcVar4 + 1;
        no_proxy = pcVar4 + 1;
        pcVar4 = no_proxy;
      } while (*pcVar8 == ',');
      bVar12 = true;
    }
    else {
      pcVar5 = strchr(no_proxy,0x2f);
      uVar3 = 0;
      pcVar6 = no_proxy;
      if (pcVar5 < no_proxy + __n && pcVar5 != (char *)0x0) {
        if (__n < 0x80) {
          uVar3 = atoi(pcVar5 + 1);
          memcpy(local_138,no_proxy,__n);
          pcVar5[(long)pcVar8] = '\0';
          pcVar6 = local_138;
          goto LAB_0013fa19;
        }
        bVar12 = false;
        unaff_R15 = local_140;
      }
      else {
LAB_0013fa19:
        if (cVar10 == '\x02') {
          if (uVar3 == 0) {
            uVar3 = 0x80;
          }
          iVar2 = inet_pton(10,name,local_158);
          if (iVar2 == 1) {
            iVar2 = inet_pton(10,pcVar6,local_168);
            bVar12 = false;
            unaff_R15 = local_140;
            if ((uVar3 < 0x88) && (bVar12 = false, iVar2 == 1)) {
              uVar9 = uVar3 >> 3;
              uVar7 = uVar3 & 7;
              if (((uVar9 == 0x10 && uVar7 != 0) ||
                  ((7 < uVar3 && (iVar2 = bcmp(local_158,local_168,(ulong)uVar9), iVar2 != 0)))) ||
                 ((uVar7 != 0 &&
                  ((byte)((*(byte *)((long)local_168 + (ulong)uVar9) ^
                          *(byte *)((long)local_158 + (ulong)uVar9)) >> (8U - (char)uVar7 & 0x1f))
                   == 0)))) {
                bVar12 = false;
                unaff_R15 = local_140;
              }
              else {
                bVar12 = true;
                unaff_R15 = local_140;
              }
            }
          }
          else {
LAB_0013fb62:
            bVar12 = false;
            unaff_R15 = local_140;
          }
        }
        else {
          bVar12 = false;
          local_158[0] = 0;
          local_168[0] = 0;
          unaff_R15 = local_140;
          if (uVar3 < 0x21) {
            iVar2 = inet_pton(2,name,local_158);
            if ((iVar2 != 1) || (iVar2 = inet_pton(2,pcVar6,local_168), iVar2 != 1))
            goto LAB_0013fb62;
            unaff_R15 = local_140;
            if ((uVar3 & 0x1f) == 0) {
              bVar12 = local_158[0] == local_168[0];
            }
            else {
              uVar7 = local_168[0] ^ local_158[0];
              bVar12 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                       uVar7 << 0x18) >> (-(char)uVar3 & 0x1fU) == 0;
            }
          }
        }
      }
LAB_0013fb77:
      if (!bVar12) goto LAB_0013fb89;
      no_proxy = no_proxy + __n;
      local_170 = true;
      bVar12 = false;
    }
  } while (bVar12);
LAB_0013fbc4:
  if (bVar11) {
    return false;
  }
  return local_170;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    char hostip[128];
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      namelen = strlen(name);
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          if(*token == '.') {
            ++token;
            --tokenlen;
            /* tailmatch */
            match = (tokenlen <= namelen) &&
              strncasecompare(token, name + (namelen - tokenlen), namelen);
          }
          else
            match = (tokenlen == namelen) &&
              strncasecompare(token, name, namelen);
          break;
        case TYPE_IPV4:
          /* FALLTHROUGH */
        case TYPE_IPV6: {
          const char *check = token;
          char *slash = strchr(check, '/');
          unsigned int bits = 0;
          char checkip[128];
          /* if the slash is part of this token, use it */
          if(slash && (slash < &check[tokenlen])) {
            bits = atoi(slash + 1);
            /* copy the check name to a temp buffer */
            if(tokenlen >= sizeof(checkip))
              break;
            memcpy(checkip, check, tokenlen);
            checkip[ slash - check ] = 0;
            check = checkip;
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}